

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

bool __thiscall
slang::ast::Expression::
visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
          (Expression *this,Expression *expr,ConstraintExprVisitor *visitor)

{
  bool bVar1;
  logic_error *this_00;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(expr->kind) {
  case Invalid:
    visitor->failed = true;
    return false;
  case IntegerLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::IntegerLiteral>(visitor,(IntegerLiteral *)expr)
    ;
    return bVar1;
  case RealLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::RealLiteral>(visitor,(RealLiteral *)expr);
    return bVar1;
  case TimeLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::TimeLiteral>(visitor,(TimeLiteral *)expr);
    return bVar1;
  case UnbasedUnsizedIntegerLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::UnbasedUnsizedIntegerLiteral>
                      (visitor,(UnbasedUnsizedIntegerLiteral *)expr);
    return bVar1;
  case NullLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::NullLiteral>(visitor,(NullLiteral *)expr);
    return bVar1;
  case UnboundedLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::UnboundedLiteral>
                      (visitor,(UnboundedLiteral *)expr);
    return bVar1;
  case StringLiteral:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::StringLiteral>(visitor,(StringLiteral *)expr);
    return bVar1;
  case NamedValue:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::NamedValueExpression>
                      (visitor,(NamedValueExpression *)expr);
    return bVar1;
  case HierarchicalValue:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::HierarchicalValueExpression>
                      (visitor,(HierarchicalValueExpression *)expr);
    return bVar1;
  case UnaryOp:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::UnaryExpression>
                      (visitor,(UnaryExpression *)expr);
    return bVar1;
  case BinaryOp:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::BinaryExpression>
                      (visitor,(BinaryExpression *)expr);
    return bVar1;
  case ConditionalOp:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ConditionalExpression>
                      (visitor,(ConditionalExpression *)expr);
    return bVar1;
  case Inside:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::InsideExpression>
                      (visitor,(InsideExpression *)expr);
    return bVar1;
  case Assignment:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::AssignmentExpression>
                      (visitor,(AssignmentExpression *)expr);
    return bVar1;
  case Concatenation:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ConcatenationExpression>
                      (visitor,(ConcatenationExpression *)expr);
    return bVar1;
  case Replication:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ReplicationExpression>
                      (visitor,(ReplicationExpression *)expr);
    return bVar1;
  case Streaming:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::StreamingConcatenationExpression>
                      (visitor,(StreamingConcatenationExpression *)expr);
    return bVar1;
  case ElementSelect:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ElementSelectExpression>
                      (visitor,(ElementSelectExpression *)expr);
    return bVar1;
  case RangeSelect:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::RangeSelectExpression>
                      (visitor,(RangeSelectExpression *)expr);
    return bVar1;
  case MemberAccess:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::MemberAccessExpression>
                      (visitor,(MemberAccessExpression *)expr);
    return bVar1;
  case Call:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::CallExpression>(visitor,(CallExpression *)expr)
    ;
    return bVar1;
  case Conversion:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ConversionExpression>
                      (visitor,(ConversionExpression *)expr);
    return bVar1;
  case DataType:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::DataTypeExpression>
                      (visitor,(DataTypeExpression *)expr);
    return bVar1;
  case TypeReference:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::TypeReferenceExpression>
                      (visitor,(TypeReferenceExpression *)expr);
    return bVar1;
  case HierarchicalReference:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::HierarchicalReferenceExpression>
                      (visitor,(HierarchicalReferenceExpression *)expr);
    return bVar1;
  case LValueReference:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::LValueReferenceExpression>
                      (visitor,(LValueReferenceExpression *)expr);
    return bVar1;
  case SimpleAssignmentPattern:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::SimpleAssignmentPatternExpression>
                      (visitor,(SimpleAssignmentPatternExpression *)expr);
    return bVar1;
  case StructuredAssignmentPattern:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::StructuredAssignmentPatternExpression>
                      (visitor,(StructuredAssignmentPatternExpression *)expr);
    return bVar1;
  case ReplicatedAssignmentPattern:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ReplicatedAssignmentPatternExpression>
                      (visitor,(ReplicatedAssignmentPatternExpression *)expr);
    return bVar1;
  case EmptyArgument:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::EmptyArgumentExpression>
                      (visitor,(EmptyArgumentExpression *)expr);
    return bVar1;
  case OpenRange:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::OpenRangeExpression>
                      (visitor,(OpenRangeExpression *)expr);
    return bVar1;
  case Dist:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::DistExpression>(visitor,(DistExpression *)expr)
    ;
    return bVar1;
  case NewArray:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::NewArrayExpression>
                      (visitor,(NewArrayExpression *)expr);
    return bVar1;
  case NewClass:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::NewClassExpression>
                      (visitor,(NewClassExpression *)expr);
    return bVar1;
  case NewCovergroup:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::NewCovergroupExpression>
                      (visitor,(NewCovergroupExpression *)expr);
    return bVar1;
  case CopyClass:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::CopyClassExpression>
                      (visitor,(CopyClassExpression *)expr);
    return bVar1;
  case MinTypMax:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::MinTypMaxExpression>
                      (visitor,(MinTypMaxExpression *)expr);
    return bVar1;
  case ClockingEvent:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::ClockingEventExpression>
                      (visitor,(ClockingEventExpression *)expr);
    return bVar1;
  case AssertionInstance:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::AssertionInstanceExpression>
                      (visitor,(AssertionInstanceExpression *)expr);
    return bVar1;
  case TaggedUnion:
    bVar1 = ConstraintExprVisitor::visit<slang::ast::TaggedUnionExpression>
                      (visitor,(TaggedUnionExpression *)expr);
    return bVar1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
             ,"");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_90);
  local_d0._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar3) {
    local_d0.field_2._M_allocated_capacity = *psVar3;
    local_d0.field_2._8_8_ = plVar2[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar3;
  }
  local_d0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::to_string(&local_70,0x15b);
  std::operator+(&local_50,&local_d0,&local_70);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_b0 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_f0 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_f0 == plVar4) {
    local_e0 = *plVar4;
    lStack_d8 = plVar2[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar4;
  }
  local_e8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

decltype(auto) Expression::visitExpression(TExpression* expr, TVisitor&& visitor,
                                           Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ExpressionKind::k: return visitor.visit(\
                        *static_cast<std::conditional_t<std::is_const_v<TExpression>, const n*, n*>>(expr),\
                            std::forward<Args>(args)...)

    switch (expr->kind) {
        case ExpressionKind::Invalid: return visitor.visitInvalid(*expr, std::forward<Args>(args)...);
        CASE(IntegerLiteral, IntegerLiteral);
        CASE(RealLiteral, RealLiteral);
        CASE(TimeLiteral, TimeLiteral);
        CASE(UnbasedUnsizedIntegerLiteral, UnbasedUnsizedIntegerLiteral);
        CASE(NullLiteral, NullLiteral);
        CASE(UnboundedLiteral, UnboundedLiteral);
        CASE(StringLiteral, StringLiteral);
        CASE(NamedValue, NamedValueExpression);
        CASE(HierarchicalValue, HierarchicalValueExpression);
        CASE(UnaryOp, UnaryExpression);
        CASE(BinaryOp, BinaryExpression);
        CASE(ConditionalOp, ConditionalExpression);
        CASE(Inside, InsideExpression);
        CASE(Assignment, AssignmentExpression);
        CASE(Concatenation, ConcatenationExpression);
        CASE(Replication, ReplicationExpression);
        CASE(Streaming, StreamingConcatenationExpression);
        CASE(ElementSelect, ElementSelectExpression);
        CASE(RangeSelect, RangeSelectExpression);
        CASE(MemberAccess, MemberAccessExpression);
        CASE(Call, CallExpression);
        CASE(Conversion, ConversionExpression);
        CASE(DataType, DataTypeExpression);
        CASE(TypeReference, TypeReferenceExpression);
        CASE(HierarchicalReference, HierarchicalReferenceExpression);
        CASE(LValueReference, LValueReferenceExpression);
        CASE(SimpleAssignmentPattern, SimpleAssignmentPatternExpression);
        CASE(StructuredAssignmentPattern, StructuredAssignmentPatternExpression);
        CASE(ReplicatedAssignmentPattern, ReplicatedAssignmentPatternExpression);
        CASE(EmptyArgument, EmptyArgumentExpression);
        CASE(OpenRange, OpenRangeExpression);
        CASE(Dist, DistExpression);
        CASE(NewArray, NewArrayExpression);
        CASE(NewClass, NewClassExpression);
        CASE(NewCovergroup, NewCovergroupExpression);
        CASE(CopyClass, CopyClassExpression);
        CASE(MinTypMax, MinTypMaxExpression);
        CASE(ClockingEvent, ClockingEventExpression);
        CASE(AssertionInstance, AssertionInstanceExpression);
        CASE(TaggedUnion, TaggedUnionExpression);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}